

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall
duckdb::ZSTDScanState::LoadNextPageForVector(ZSTDScanState *this,ZSTDVectorScanState *scan_state)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  InternalException *this_00;
  ulong uVar3;
  shared_ptr<duckdb::BlockHandle,_true> block;
  BufferHandle handle;
  
  if ((scan_state->in_buffer).pos == (scan_state->in_buffer).size) {
    LoadPage((ZSTDScanState *)&block,(block_id_t)this);
    (*this->buffer_manager->_vptr_BufferManager[7])
              (&handle,this->buffer_manager,(ZSTDScanState *)&block);
    pdVar1 = BufferHandle::Ptr(&handle);
    ::std::vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>::
    emplace_back<duckdb::BufferHandle>
              (&(scan_state->buffer_handles).
                super_vector<duckdb::BufferHandle,_std::allocator<duckdb::BufferHandle>_>,&handle);
    scan_state->current_buffer_ptr = pdVar1;
    (scan_state->in_buffer).src = pdVar1;
    (scan_state->in_buffer).pos = 0;
    iVar2 = BlockManager::GetBlockSize(this->block_manager);
    uVar3 = (scan_state->metadata).compressed_size - scan_state->compressed_scan_count;
    if (iVar2 - 8 < uVar3) {
      uVar3 = iVar2 - 8;
    }
    (scan_state->in_buffer).size = uVar3;
    BufferHandle::~BufferHandle(&handle);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&block.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&handle,
             "(ZSTDScanState::LoadNextPageForVector) Trying to load the next page before consuming the current one"
             ,(allocator *)&block);
  InternalException::InternalException(this_00,(string *)&handle);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LoadNextPageForVector(ZSTDVectorScanState &scan_state) {
		if (scan_state.in_buffer.pos != scan_state.in_buffer.size) {
			throw InternalException(
			    "(ZSTDScanState::LoadNextPageForVector) Trying to load the next page before consuming the current one");
		}
		// Read the next block id from the end of the page
		auto base_ptr =
		    reinterpret_cast<data_ptr_t>(const_cast<void *>(scan_state.in_buffer.src)); // NOLINT: const cast
		auto next_id_ptr = base_ptr + scan_state.in_buffer.size;
		block_id_t next_id = Load<block_id_t>(next_id_ptr);

		// Load the next page
		auto block = LoadPage(next_id);
		auto handle = buffer_manager.Pin(block);
		auto ptr = handle.Ptr();
		scan_state.buffer_handles.push_back(std::move(handle));
		scan_state.current_buffer_ptr = ptr;

		// Update the in_buffer to point to the new page
		scan_state.in_buffer.src = ptr;
		scan_state.in_buffer.pos = 0;

		idx_t page_size = block_manager.GetBlockSize() - sizeof(block_id_t);
		idx_t remaining_compressed_data = scan_state.metadata.compressed_size - scan_state.compressed_scan_count;
		scan_state.in_buffer.size = MinValue<idx_t>(page_size, remaining_compressed_data);
	}